

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_text.cpp
# Opt level: O2

int main(void)

{
  char text [100];
  
  builtin_strncpy(text,"hey Lou, how are you?",0x16);
  printf("Original: %s \n",text);
  obme::OBME_T(text);
  printf("Obfuscated: %s \n",text);
  obme::OBME_T(text);
  printf("Restored: %s \n",text);
  return 1;
}

Assistant:

int main()
{
	char text[100];
	strcpy(text, "hey Lou, how are you?");
	printf("Original: %s \n", text);
	OBME_T(text);
    
	printf("Obfuscated: %s \n", text);
	OBME_T(text);
	printf("Restored: %s \n", text);
	
	return 1;
}